

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_decodeBinaryInternal(void *dst,UA_DataType *type)

{
  ushort uVar1;
  UA_DataTypeMember *pUVar2;
  UA_StatusCode UVar3;
  UA_DataType *type_00;
  void *pvVar4;
  uint local_6c;
  size_t *length;
  size_t memSize;
  size_t fi;
  UA_DataType *membertype;
  UA_DataTypeMember *member;
  size_t i;
  UA_DataType *typelists [2];
  UA_Byte membersSize;
  size_t *psStack_20;
  UA_StatusCode retval;
  uintptr_t ptr;
  UA_DataType *type_local;
  void *dst_local;
  
  typelists[1]._4_4_ = 0;
  typelists[1]._3_1_ = type->membersSize;
  typelists[0] = type + (int)-(uint)type->typeIndex;
  psStack_20 = (size_t *)dst;
  for (member = (UA_DataTypeMember *)0x0; member < (UA_DataTypeMember *)(ulong)typelists[1]._3_1_;
      member = (UA_DataTypeMember *)((long)&member->memberName + 1)) {
    pUVar2 = type->members;
    type_00 = typelists[(long)(int)(uint)((pUVar2[(long)member].field_0xb & 1 ^ 0xff) & 1) + -1] +
              pUVar2[(long)member].memberTypeIndex;
    if (((byte)pUVar2[(long)member].field_0xb >> 1 & 1) == 0) {
      pvVar4 = (void *)((ulong)pUVar2[(long)member].padding + (long)psStack_20);
      if ((type_00->field_0x25 & 1) == 0) {
        local_6c = 0x19;
      }
      else {
        local_6c = (uint)type_00->typeIndex;
      }
      uVar1 = type_00->memSize;
      UVar3 = (*decodeBinaryJumpTable[local_6c])(pvVar4,type_00);
      typelists[1]._4_4_ = UVar3 | typelists[1]._4_4_;
      psStack_20 = (size_t *)((ulong)uVar1 + (long)pvVar4);
    }
    else {
      psStack_20 = (size_t *)((ulong)pUVar2[(long)member].padding + (long)psStack_20);
      UVar3 = Array_decodeBinary((void **)(psStack_20 + 1),psStack_20,type_00);
      typelists[1]._4_4_ = UVar3 | typelists[1]._4_4_;
      psStack_20 = psStack_20 + 2;
    }
  }
  return typelists[1]._4_4_;
}

Assistant:

static UA_StatusCode
UA_decodeBinaryInternal(void *dst, const UA_DataType *type) {
    uintptr_t ptr = (uintptr_t)dst;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_Byte membersSize = type->membersSize;
    const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *member = &type->members[i];
        const UA_DataType *membertype = &typelists[!member->namespaceZero][member->memberTypeIndex];
        if(!member->isArray) {
            ptr += member->padding;
            size_t fi = membertype->builtin ? membertype->typeIndex : UA_BUILTIN_TYPES_COUNT;
            size_t memSize = membertype->memSize;
            retval |= decodeBinaryJumpTable[fi]((void *UA_RESTRICT)ptr, membertype);
            ptr += memSize;
        } else {
            ptr += member->padding;
            size_t *length = (size_t*)ptr;
            ptr += sizeof(size_t);
            retval |= Array_decodeBinary((void *UA_RESTRICT *UA_RESTRICT)ptr, length, membertype);
            ptr += sizeof(void*);
        }
    }
    return retval;
}